

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

void __thiscall SQFuncState::AddLineInfos(SQFuncState *this,SQInteger line,bool lineop,bool force)

{
  SQUnsignedInteger SVar1;
  ulong uVar2;
  ulong uVar3;
  SQUnsignedInteger SVar4;
  undefined8 in_RAX;
  SQLineInfo *pSVar5;
  SQUnsignedInteger SVar6;
  bool bVar7;
  SQInstruction local_28;
  
  bVar7 = this->_lastline == line;
  local_28._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  local_28._arg1._0_1_ = bVar7;
  if (!bVar7 || force) {
    SVar1 = (this->_instructions)._size;
    if (lineop) {
      local_28 = (SQInstruction)(line & 0xffffffff);
      AddInstruction(this,&local_28);
    }
    if (this->_lastline != line) {
      uVar2 = (this->_lineinfos)._size;
      uVar3 = (this->_lineinfos)._allocated;
      if (uVar3 <= uVar2) {
        SVar4 = uVar2 * 2;
        SVar6 = 4;
        if (SVar4 != 0) {
          SVar6 = SVar4;
        }
        pSVar5 = (SQLineInfo *)sq_vm_realloc((this->_lineinfos)._vals,uVar3 << 4,SVar6 << 4);
        (this->_lineinfos)._vals = pSVar5;
        (this->_lineinfos)._allocated = SVar6;
      }
      pSVar5 = (this->_lineinfos)._vals;
      SVar4 = (this->_lineinfos)._size;
      (this->_lineinfos)._size = SVar4 + 1;
      pSVar5[SVar4]._line = line;
      pSVar5[SVar4]._op = SVar1;
    }
    this->_lastline = line;
  }
  return;
}

Assistant:

void SQFuncState::AddLineInfos(SQInteger line,bool lineop,bool force)
{
    if(_lastline!=line || force){
        SQLineInfo li;
        li._line=line;li._op=(GetCurrentPos()+1);
        if(lineop)AddInstruction(_OP_LINE,0,line);
        if(_lastline!=line) {
            _lineinfos.push_back(li);
        }
        _lastline=line;
    }
}